

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::getDifferentiationWeights
          (GridLocalPolynomial *this,double *x,double *weights)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  vector<int,_std::allocator<int>_> *__range1;
  long lVar5;
  MultiIndexSet *work;
  vector<int,_std::allocator<int>_> active_points;
  vector<double,_std::allocator<double>_> diff_hbasis_values;
  vector<int,_std::allocator<int>_> local_58;
  vector<double,_std::allocator<double>_> local_38;
  
  work = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    work = &(this->super_BaseCanonicalGrid).needed;
  }
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (long)work->cache_num_indexes) {
    memset(weights,0,(long)work->cache_num_indexes << 3);
  }
  walkTree<4>(this,work,x,&local_58,&local_38,(double *)0x0);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    piVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (int)uVar1) {
        iVar2 = *piVar3;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)weights + lVar5 + (long)iVar2 * (long)(int)uVar1 * 8) =
               *(undefined8 *)((long)pdVar4 + lVar5);
          lVar5 = lVar5 + 8;
        } while ((ulong)uVar1 << 3 != lVar5);
        pdVar4 = (pointer)((long)pdVar4 + lVar5);
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  applyTransformationTransposed<1>(this,weights,work,&local_58);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::getDifferentiationWeights(const double x[], double weights[]) const {
    // Based on GridLocalPolynomial::getInterpolationWeights().
    const MultiIndexSet &work = (points.empty()) ? needed : points;

    std::vector<int> active_points;
    std::vector<double> diff_hbasis_values;
    std::fill_n(weights, work.getNumIndexes(), 0.0);

    walkTree<4>(work, x, active_points, diff_hbasis_values, nullptr);
    auto ibasis = diff_hbasis_values.begin();
    for(auto i : active_points)
        for (int d=0; d<num_dimensions; d++)
            weights[i * num_dimensions + d] = *ibasis++;
    applyTransformationTransposed<1>(weights, work, active_points);
}